

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float32 floatx80_to_float32_m68k(floatx80 a,float_status *status)

{
  ulong uVar1;
  commonNaNT a_00;
  float32 fVar2;
  ushort uVar3;
  ulong uVar4;
  int zExp;
  int iVar5;
  bool bVar6;
  floatx80 a_01;
  commonNaNT local_28;
  
  uVar4 = a.low;
  a_01._8_8_ = a._8_8_ & 0xffffffff;
  uVar3 = (ushort)a_01._8_8_ & 0x7fff;
  bVar6 = ((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0;
  if (bVar6 && -1 < (long)uVar4) {
    status->float_exception_flags = status->float_exception_flags | 1;
    fVar2 = float32_default_nan_m68k
                      ((float_status *)CONCAT71(a.low._1_7_,bVar6 && -1 < (long)uVar4));
    return fVar2;
  }
  uVar1 = (a._8_8_ & 0xffff) >> 0xf;
  if (uVar3 == 0x7fff) {
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) {
      fVar2 = (int)uVar1 << 0x1f | 0x7f800000;
    }
    else {
      a_01.low = uVar4;
      floatx80ToCommonNaN(&local_28,a_01,status);
      a_00.high = local_28.high;
      a_00.sign = local_28.sign;
      a_00._1_7_ = local_28._1_7_;
      a_00.low = local_28.low;
      fVar2 = commonNaNToFloat32(a_00,status);
    }
    return fVar2;
  }
  uVar4 = (ulong)(((undefined1  [16])a & (undefined1  [16])0x1ffffffff) != (undefined1  [16])0x0) |
          uVar4 >> 0x21;
  iVar5 = uVar3 - 0x3f81;
  zExp = 0;
  if (uVar4 != 0) {
    zExp = iVar5;
  }
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0) {
    zExp = iVar5;
  }
  fVar2 = roundAndPackFloat32((flag)uVar1,zExp,(uint32_t)uVar4,status);
  return fVar2;
}

Assistant:

float32 floatx80_to_float32(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig;

    if (floatx80_invalid_encoding(a)) {
        float_raise(float_flag_invalid, status);
        return float32_default_nan(status);
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    if ( aExp == 0x7FFF ) {
        if ( (uint64_t) ( aSig<<1 ) ) {
            return commonNaNToFloat32(floatx80ToCommonNaN(a, status), status);
        }
        return packFloat32( aSign, 0xFF, 0 );
    }
    shift64RightJamming( aSig, 33, &aSig );
    if ( aExp || aSig ) aExp -= 0x3F81;
    return roundAndPackFloat32(aSign, aExp, aSig, status);

}